

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O2

void wall_extends(level *lev,int x1,int y1,int x2,int y2)

{
  int x;
  int y;
  boolean bVar1;
  boolean bVar2;
  boolean bVar3;
  boolean bVar4;
  boolean bVar5;
  boolean bVar6;
  boolean bVar7;
  boolean bVar8;
  boolean bVar9;
  int x_00;
  uint uVar10;
  int y_00;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  int x_01;
  int y_01;
  uint uVar15;
  uint uVar16;
  
  if ((((x2 < 0x50 && -1 < x1) && (y1 <= y2)) && (-1 < y1)) && ((x1 <= x2 && (y2 < 0x15)))) {
    lVar12 = (long)x1;
    while (lVar14 = lVar12, lVar14 <= x2) {
      x = (int)lVar14;
      x_00 = x + -1;
      lVar12 = (long)y1;
      while (lVar11 = lVar12, lVar12 = lVar14 + 1, lVar11 <= y2) {
        if ((byte)(lev->locations[lVar14][lVar11].typ - 1U) < 0xb) {
          y = (int)lVar11;
          y_01 = y + -1;
          bVar1 = iswall_or_stone(lev,x_00,y_01);
          bVar2 = iswall_or_stone(lev,x,y_01);
          x_01 = (int)(lVar14 + 1);
          bVar3 = iswall_or_stone(lev,x_01,y_01);
          bVar4 = iswall_or_stone(lev,x_00,y);
          bVar5 = iswall_or_stone(lev,x_01,y);
          lVar12 = lVar11 + 1;
          y_00 = (int)lVar12;
          bVar6 = iswall_or_stone(lev,x_00,y_00);
          bVar7 = iswall_or_stone(lev,x,y_00);
          bVar8 = iswall_or_stone(lev,x_01,y_00);
          bVar9 = iswall(lev,x,y_01);
          uVar15 = 0;
          uVar10 = 0;
          if (bVar9 != '\0') {
            uVar10 = (uint)(bVar3 == '\0' || (bVar1 == '\0' || (bVar5 == '\0' || bVar4 == '\0'))) <<
                     3;
          }
          bVar9 = iswall(lev,x,y_00);
          if (bVar9 != '\0') {
            uVar15 = (uint)(bVar8 == '\0' || (bVar6 == '\0' || (bVar5 == '\0' || bVar4 == '\0'))) <<
                     2;
          }
          bVar4 = iswall(lev,x_01,y);
          uVar16 = 0;
          uVar13 = 0;
          if (bVar4 != '\0') {
            uVar13 = (uint)((bVar8 == '\0' || bVar3 == '\0') || (bVar7 == '\0' || bVar2 == '\0')) *
                     2;
          }
          bVar3 = iswall(lev,x_00,y);
          if (bVar3 != '\0') {
            uVar16 = (uint)((bVar6 == '\0' || bVar1 == '\0') || (bVar7 == '\0' || bVar2 == '\0'));
          }
          uVar16 = uVar15 | uVar10 | uVar13 | uVar16;
          if (uVar16 != 0) {
            lev->locations[lVar14][lVar11].typ =
                 "\x01\x02\x02\x02\x01\x04\x03\t\x01\x06\x05\b\x01\n\v\a"[uVar16];
          }
        }
        else {
          lVar12 = lVar11 + 1;
        }
      }
    }
    return;
  }
  panic("wall_extends: bad bounds (%d,%d) to (%d,%d)",(ulong)(uint)x1,(ulong)(uint)y1,
        (ulong)(uint)x2,(ulong)(uint)y2);
}

Assistant:

void wall_extends(struct level *lev, int x1, int y1, int x2, int y2)
{
	uchar type;
	int x, y;
	struct rm *loc;
	int bits;
	int locale[3][3];	/* rock or wall status surrounding positions */
	/*
	 * Value 0 represents a free-standing wall.  It could be anything,
	 * so even though this table says VWALL, we actually leave whatever
	 * typ was there alone.
	 */
	static const xchar spine_array[16] = {
	    VWALL,	HWALL,		HWALL,		HWALL,
	    VWALL,	TRCORNER,	TLCORNER,	TDWALL,
	    VWALL,	BRCORNER,	BLCORNER,	TUWALL,
	    VWALL,	TLWALL,		TRWALL,		CROSSWALL
	};

	/* sanity check on incoming variables */
	if (x1 < 0 || x2 >= COLNO || x1 > x2 || y1 < 0 || y2 >= ROWNO || y1 > y2)
	    panic("wall_extends: bad bounds (%d,%d) to (%d,%d)", x1, y1, x2, y2);

	for (x = x1; x <= x2; x++)
	    for (y = y1; y <= y2; y++) {
		loc = &lev->locations[x][y];
		type = loc->typ;
		if ( !(IS_WALL(type) && type != DBWALL)) continue;

		/* set the locations TRUE if rock or wall or out of bounds */
		locale[0][0] = iswall_or_stone(lev, x-1, y-1);
		locale[1][0] = iswall_or_stone(lev,   x, y-1);
		locale[2][0] = iswall_or_stone(lev, x+1, y-1);

		locale[0][1] = iswall_or_stone(lev, x-1,   y);
		locale[2][1] = iswall_or_stone(lev, x+1,   y);

		locale[0][2] = iswall_or_stone(lev, x-1, y+1);
		locale[1][2] = iswall_or_stone(lev,   x, y+1);
		locale[2][2] = iswall_or_stone(lev, x+1, y+1);

		/* determine if wall should extend to each direction NSEW */
		bits =    (extend_spine(locale, iswall(lev, x,y-1),  0, -1) << 3)
			| (extend_spine(locale, iswall(lev, x,y+1),  0,  1) << 2)
			| (extend_spine(locale, iswall(lev, x+1,y),  1,  0) << 1)
			|  extend_spine(locale, iswall(lev, x-1,y), -1,  0);

		/* don't change typ if wall is free-standing */
		if (bits) loc->typ = spine_array[bits];
	    }
}